

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::UseRewriter::GetOrBuildIncoming
          (UseRewriter *this,uint32_t bb_id)

{
  uint32_t *puVar1;
  CFG *this_00;
  bool bVar2;
  uint32_t uVar3;
  BasicBlock *pBVar4;
  IRContext *pIVar5;
  size_type sVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  pointer puVar9;
  Instruction *pIVar10;
  mapped_type pIVar11;
  pointer puVar12;
  long lVar13;
  size_t i;
  ulong uVar14;
  uint32_t bb_id_local;
  BasicBlock *bb;
  BasicBlock *local_88;
  IRContext *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> incomings;
  InstructionBuilder builder;
  mapped_type local_38;
  
  bb_id_local = bb_id;
  pBVar4 = CFG::block(this->base_->cfg_,bb_id);
  if (pBVar4 == (BasicBlock *)0x0) {
    __assert_fail("base_->cfg_->block(bb_id) != nullptr && \"Unknown basic block\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0x99,
                  "Instruction *spvtools::opt::(anonymous namespace)::LCSSARewriter::UseRewriter::GetOrBuildIncoming(uint32_t)"
                 );
  }
  pIVar5 = (IRContext *)
           std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->bb_to_phi_,&bb_id_local);
  if ((mapped_type)pIVar5->syntax_context_ != (mapped_type)0x0) {
    return (mapped_type)pIVar5->syntax_context_;
  }
  bb = CFG::block(this->base_->cfg_,bb_id_local);
  sVar6 = std::
          _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this->base_->exit_bb_->_M_h,&bb);
  if (sVar6 == 0) {
    pvVar7 = GetDefiningBlocks(this->base_,bb_id_local);
    pBVar4 = bb;
    puVar1 = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (4 < (ulong)((long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
      incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00 = this->base_->cfg_;
      local_88 = bb;
      local_80 = pIVar5;
      uVar3 = BasicBlock::id(bb);
      pvVar8 = CFG::preds(this_00,uVar3);
      puVar12 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)puVar9 - (long)puVar12 ==
          (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start) {
        lVar13 = 0;
        for (uVar14 = 0; uVar14 < (ulong)((long)puVar9 - (long)puVar12 >> 2); uVar14 = uVar14 + 1) {
          pIVar10 = GetOrBuildIncoming(this,*(uint32_t *)
                                             ((long)(pvVar7->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                             lVar13));
          uVar3 = Instruction::result_id(pIVar10);
          builder.context_ = (IRContext *)CONCAT44(builder.context_._4_4_,uVar3);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&incomings,(uint *)&builder);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&incomings,
                     (value_type_conflict1 *)
                     ((long)(pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar13));
          puVar12 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar9 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          lVar13 = lVar13 + 4;
        }
        InstructionBuilder::InstructionBuilder
                  (&builder,this->base_->context_,
                   (local_88->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
                   kAnalysisInstrToBlockMapping);
        uVar3 = Instruction::type_id(this->def_insn_);
        local_38 = InstructionBuilder::AddPhi
                             (&builder,uVar3,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &incomings.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,0);
        std::__detail::
        _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->rewritten_,&local_38);
        pIVar11 = local_38;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        local_80->syntax_context_ = (spv_context)pIVar11;
        return pIVar11;
      }
      __assert_fail("bb_preds.size() == defining_blocks.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                    ,0x71,
                    "Instruction *spvtools::opt::(anonymous namespace)::LCSSARewriter::UseRewriter::CreatePhiInstruction(BasicBlock *, const std::vector<uint32_t> &)"
                   );
    }
    if (bb_id_local != this->base_->merge_block_id_) {
      pIVar11 = GetOrBuildIncoming(this,*puVar1);
      goto LAB_004e9bcd;
    }
    pIVar10 = GetOrBuildIncoming(this,*puVar1);
  }
  else {
    builder._24_8_ =
         std::
         _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:166:35)>
         ::_M_invoke;
    builder.insert_before_.super_iterator.node_ =
         (iterator)
         std::
         _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:166:35)>
         ::_M_manager;
    builder.context_ = pIVar5;
    builder.parent_ = (BasicBlock *)this;
    bVar2 = BasicBlock::WhileEachPhiInst
                      (bb,(function<bool_(spvtools::opt::Instruction_*)> *)&builder,false);
    if (builder.insert_before_.super_iterator.node_ != (Instruction *)0x0) {
      (*(code *)builder.insert_before_.super_iterator.node_)(&builder,&builder,3);
    }
    if (!bVar2) {
      return (mapped_type)pIVar5->syntax_context_;
    }
    pIVar10 = this->def_insn_;
    pBVar4 = bb;
  }
  pIVar11 = CreatePhiInstruction(this,pBVar4,pIVar10);
LAB_004e9bcd:
  pIVar5->syntax_context_ = (spv_context)pIVar11;
  return pIVar11;
}

Assistant:

Instruction* GetOrBuildIncoming(uint32_t bb_id) {
      assert(base_->cfg_->block(bb_id) != nullptr && "Unknown basic block");

      Instruction*& incoming_phi = bb_to_phi_[bb_id];
      if (incoming_phi) {
        return incoming_phi;
      }

      BasicBlock* bb = &*base_->cfg_->block(bb_id);
      // If this is an exit basic block, look if there already is an eligible
      // phi instruction. An eligible phi has |def_insn_| as all incoming
      // values.
      if (base_->exit_bb_.count(bb)) {
        // Look if there is an eligible phi in this block.
        if (!bb->WhileEachPhiInst([&incoming_phi, this](Instruction* phi) {
              for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
                if (phi->GetSingleWordInOperand(i) != def_insn_.result_id())
                  return true;
              }
              incoming_phi = phi;
              rewritten_.insert(incoming_phi);
              return false;
            })) {
          return incoming_phi;
        }
        incoming_phi = CreatePhiInstruction(bb, def_insn_);
        return incoming_phi;
      }

      // Get the block that defines the value to use for each predecessor.
      // If the vector has 1 value, then it means that this block does not need
      // to build a phi instruction unless |bb_id| is the loop merge block.
      const std::vector<uint32_t>& defining_blocks =
          base_->GetDefiningBlocks(bb_id);

      // Special case for structured loops: merge block might be different from
      // the exit block set. To maintain structured properties it will ease
      // transformations if the merge block also holds a phi instruction like
      // the exit ones.
      if (defining_blocks.size() > 1 || bb_id == base_->merge_block_id_) {
        if (defining_blocks.size() > 1) {
          incoming_phi = CreatePhiInstruction(bb, defining_blocks);
        } else {
          assert(bb_id == base_->merge_block_id_);
          incoming_phi =
              CreatePhiInstruction(bb, *GetOrBuildIncoming(defining_blocks[0]));
        }
      } else {
        incoming_phi = GetOrBuildIncoming(defining_blocks[0]);
      }

      return incoming_phi;
    }